

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

uchar GetDepth(Col_Word list)

{
  uint uVar1;
  byte *pbVar2;
  
  if (list != 0) {
    pbVar2 = (byte *)list;
    do {
      if (((ulong)pbVar2 & 0xf) == 0) {
        if ((*pbVar2 & 2) == 0) {
          return '\0';
        }
        uVar1 = *pbVar2 & 0xfffffffe;
      }
      else {
        uVar1 = immediateWordTypes[(uint)pbVar2 & 0x1f];
      }
      if (uVar1 != 0xfffffffa) {
        if (0x26 < uVar1) {
          return '\0';
        }
        if ((0x4440000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          return '\0';
        }
        return pbVar2[1];
      }
      pbVar2 = (byte *)(list & 0xfffffffffffffff7);
    } while ((byte *)(list & 0xfffffffffffffff7) != (byte *)0x0);
  }
  return '\0';
}

Assistant:

static unsigned char
GetDepth(
    Col_Word rope)  /*!< Rope node to get depth from. */
{
    switch (WORD_TYPE(rope)) {
    case WORD_TYPE_SUBROPE:
        return WORD_SUBROPE_DEPTH(rope);

    case WORD_TYPE_CONCATROPE:
        return WORD_CONCATROPE_DEPTH(rope);

    /* WORD_TYPE_UNKNOWN */

    default:
        return 0;
    }
}